

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall cmMakefileCurrent::cmMakefileCurrent(cmMakefileCurrent *this,cmMakefile *mf)

{
  cmGlobalGenerator *pcVar1;
  cmake *pcVar2;
  cmState *pcVar3;
  cmLinkedTree<cmState::SnapshotDataType> *pcVar4;
  
  cmState::Snapshot::Snapshot(&this->Snapshot,(cmState *)0x0,(PositionType)ZEXT816(0));
  pcVar1 = mf->LocalGenerator->GlobalGenerator;
  this->GG = pcVar1;
  this->MF = pcVar1->CurrentMakefile;
  pcVar2 = pcVar1->CMakeInstance;
  pcVar3 = (pcVar2->CurrentSnapshot).State;
  pcVar4 = (pcVar2->CurrentSnapshot).Position.Tree;
  (this->Snapshot).Position.Position = (pcVar2->CurrentSnapshot).Position.Position;
  (this->Snapshot).State = pcVar3;
  (this->Snapshot).Position.Tree = pcVar4;
  pcVar1->CurrentMakefile = mf;
  cmFileLockPool::PushFileScope(&pcVar1->FileLockPool);
  return;
}

Assistant:

cmMakefileCurrent(cmMakefile* mf)
    {
    this->GG = mf->GetGlobalGenerator();
    this->MF = this->GG->GetCurrentMakefile();
    this->Snapshot = this->GG->GetCMakeInstance()->GetCurrentSnapshot();
    this->GG->GetCMakeInstance()->SetCurrentSnapshot(
          this->GG->GetCMakeInstance()->GetCurrentSnapshot());
    this->GG->SetCurrentMakefile(mf);
#if defined(CMAKE_BUILD_WITH_CMAKE)
    this->GG->GetFileLockPool().PushFileScope();
#endif
    }